

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx512bw_blend_popcnt_unroll8(uint16_t *data,uint32_t len,uint32_t *flags)

{
  uint uVar1;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined8 uVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  int j;
  int i_3;
  __m512i input1_2;
  __m512i input0_2;
  __m512i v1_2;
  __m512i v0_2;
  int i_2;
  __m512i input3_1;
  __m512i input2_1;
  __m512i input1_1;
  __m512i input0_1;
  __m512i v3_1;
  __m512i v2_1;
  __m512i v1_1;
  __m512i v0_1;
  int i_1;
  __m512i input7;
  __m512i input6;
  __m512i input5;
  __m512i input4;
  __m512i input3;
  __m512i input2;
  __m512i input1;
  __m512i input0;
  __m512i v7;
  __m512i v6;
  __m512i v5;
  __m512i v4;
  __m512i v3;
  __m512i v2;
  __m512i v1;
  __m512i v0;
  size_t i;
  uint32_t n_cycles;
  __m512i *data_vectors;
  undefined4 local_2148;
  undefined4 local_2144;
  undefined1 local_2140 [64];
  undefined1 local_2100 [64];
  undefined4 local_2004;
  undefined1 local_2000 [64];
  undefined1 local_1fc0 [64];
  undefined1 local_1f80 [64];
  undefined1 local_1f40 [64];
  undefined4 local_1dc4;
  undefined1 local_1dc0 [64];
  undefined1 local_1d80 [64];
  undefined1 local_1d40 [64];
  undefined1 local_1d00 [64];
  undefined1 local_1cc0 [64];
  undefined1 local_1c80 [64];
  undefined1 local_1c40 [64];
  undefined1 local_1c00 [64];
  undefined8 local_19a8;
  
  uVar1 = in_ESI >> 5;
  for (local_19a8 = 0; local_19a8 + 8 <= (ulong)uVar1; local_19a8 = local_19a8 + 8) {
    auVar3 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_19a8 * 0x40));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x40 + local_19a8 * 0x40));
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x80 + local_19a8 * 0x40));
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0xc0 + local_19a8 * 0x40));
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar7 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x100 + local_19a8 * 0x40));
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x140 + local_19a8 * 0x40));
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x180 + local_19a8 * 0x40));
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x1c0 + local_19a8 * 0x40));
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar11 = vmovdqa64_avx512f(auVar3);
    auVar12 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar13 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar4);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vpsllw_avx512bw(auVar12,ZEXT416(8));
    auVar12 = vpternlogd_avx512f(auVar11,auVar13,auVar12,0xea);
    local_1c00 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar11 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(8));
    auVar3 = vpternlogd_avx512f(auVar12,auVar11,auVar3,0xea);
    local_1c40 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar5);
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar12 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar6);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpsllw_avx512bw(auVar3,ZEXT416(8));
    auVar3 = vpternlogd_avx512f(auVar4,auVar12,auVar3,0xea);
    local_1c80 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar5);
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar6);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(8));
    auVar3 = vpternlogd_avx512f(auVar4,auVar5,auVar3,0xea);
    local_1cc0 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar7);
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar8);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpsllw_avx512bw(auVar3,ZEXT416(8));
    auVar3 = vpternlogd_avx512f(auVar4,auVar5,auVar3,0xea);
    local_1d00 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar7);
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar8);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(8));
    auVar3 = vpternlogd_avx512f(auVar4,auVar5,auVar3,0xea);
    local_1d40 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar9);
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar10);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpsllw_avx512bw(auVar3,ZEXT416(8));
    auVar3 = vpternlogd_avx512f(auVar4,auVar5,auVar3,0xea);
    local_1d80 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar9);
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar10);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(8));
    auVar3 = vpternlogd_avx512f(auVar4,auVar5,auVar3,0xea);
    local_1dc0 = vmovdqa64_avx512f(auVar3);
    for (local_1dc4 = 0; local_1dc4 < 8; local_1dc4 = local_1dc4 + 1) {
      auVar3 = vmovdqa64_avx512f(local_1c00);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(7 - local_1dc4) * 4) =
           *(int *)(in_RDX + (long)(7 - local_1dc4) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_1c40);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(0xf - local_1dc4) * 4) =
           *(int *)(in_RDX + (long)(0xf - local_1dc4) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_1c80);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(7 - local_1dc4) * 4) =
           *(int *)(in_RDX + (long)(7 - local_1dc4) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_1cc0);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(0xf - local_1dc4) * 4) =
           *(int *)(in_RDX + (long)(0xf - local_1dc4) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_1d00);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(7 - local_1dc4) * 4) =
           *(int *)(in_RDX + (long)(7 - local_1dc4) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_1d40);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(0xf - local_1dc4) * 4) =
           *(int *)(in_RDX + (long)(0xf - local_1dc4) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_1d80);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(7 - local_1dc4) * 4) =
           *(int *)(in_RDX + (long)(7 - local_1dc4) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_1dc0);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(0xf - local_1dc4) * 4) =
           *(int *)(in_RDX + (long)(0xf - local_1dc4) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_1c00);
      auVar4 = vmovdqa64_avx512f(local_1c00);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_1c00 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1c40);
      auVar4 = vmovdqa64_avx512f(local_1c40);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_1c40 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1c80);
      auVar4 = vmovdqa64_avx512f(local_1c80);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_1c80 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1cc0);
      auVar4 = vmovdqa64_avx512f(local_1cc0);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_1cc0 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1d00);
      auVar4 = vmovdqa64_avx512f(local_1d00);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_1d00 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1d40);
      auVar4 = vmovdqa64_avx512f(local_1d40);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_1d40 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1d80);
      auVar4 = vmovdqa64_avx512f(local_1d80);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_1d80 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1dc0);
      auVar4 = vmovdqa64_avx512f(local_1dc0);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_1dc0 = vmovdqa64_avx512f(auVar3);
    }
  }
  for (; local_19a8 + 4 <= (ulong)uVar1; local_19a8 = local_19a8 + 4) {
    auVar3 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_19a8 * 0x40));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x40 + local_19a8 * 0x40));
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x80 + local_19a8 * 0x40));
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0xc0 + local_19a8 * 0x40));
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar8 = vmovdqa64_avx512f(auVar3);
    auVar7 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar9 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar4);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vpsllw_avx512bw(auVar7,ZEXT416(8));
    auVar7 = vpternlogd_avx512f(auVar8,auVar9,auVar7,0xea);
    local_1f40 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar8 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(8));
    auVar3 = vpternlogd_avx512f(auVar7,auVar8,auVar3,0xea);
    local_1f80 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar5);
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar7 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar6);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpsllw_avx512bw(auVar3,ZEXT416(8));
    auVar3 = vpternlogd_avx512f(auVar4,auVar7,auVar3,0xea);
    local_1fc0 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqa64_avx512f(auVar5);
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar5 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar6);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(8));
    auVar3 = vpternlogd_avx512f(auVar4,auVar5,auVar3,0xea);
    local_2000 = vmovdqa64_avx512f(auVar3);
    for (local_2004 = 0; local_2004 < 8; local_2004 = local_2004 + 1) {
      auVar3 = vmovdqa64_avx512f(local_1f40);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(7 - local_2004) * 4) =
           *(int *)(in_RDX + (long)(7 - local_2004) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_1f80);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(0xf - local_2004) * 4) =
           *(int *)(in_RDX + (long)(0xf - local_2004) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_1fc0);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(7 - local_2004) * 4) =
           *(int *)(in_RDX + (long)(7 - local_2004) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_2000);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(0xf - local_2004) * 4) =
           *(int *)(in_RDX + (long)(0xf - local_2004) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_1f40);
      auVar4 = vmovdqa64_avx512f(local_1f40);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_1f40 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1f80);
      auVar4 = vmovdqa64_avx512f(local_1f80);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_1f80 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_1fc0);
      auVar4 = vmovdqa64_avx512f(local_1fc0);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_1fc0 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_2000);
      auVar4 = vmovdqa64_avx512f(local_2000);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_2000 = vmovdqa64_avx512f(auVar3);
    }
  }
  for (; local_19a8 + 2 <= (ulong)uVar1; local_19a8 = local_19a8 + 2) {
    auVar3 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_19a8 * 0x40));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar4 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + 0x40 + local_19a8 * 0x40));
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar6 = vmovdqa64_avx512f(auVar3);
    auVar5 = vpbroadcastw_avx512bw(ZEXT216(0xff));
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar4);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpsllw_avx512bw(auVar5,ZEXT416(8));
    auVar5 = vpternlogd_avx512f(auVar6,auVar7,auVar5,0xea);
    local_2100 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xff00));
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar6 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar4);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(auVar3);
    auVar3 = vpsrlw_avx512bw(auVar3,ZEXT416(8));
    auVar3 = vpternlogd_avx512f(auVar5,auVar6,auVar3,0xea);
    local_2140 = vmovdqa64_avx512f(auVar3);
    for (local_2144 = 0; local_2144 < 8; local_2144 = local_2144 + 1) {
      auVar3 = vmovdqa64_avx512f(local_2100);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(7 - local_2144) * 4) =
           *(int *)(in_RDX + (long)(7 - local_2144) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_2140);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(auVar3);
      uVar2 = vpmovb2m_avx512bw(auVar3);
      *(int *)(in_RDX + (long)(0xf - local_2144) * 4) =
           *(int *)(in_RDX + (long)(0xf - local_2144) * 4) + (int)POPCOUNT(uVar2);
      auVar3 = vmovdqa64_avx512f(local_2100);
      auVar4 = vmovdqa64_avx512f(local_2100);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_2100 = vmovdqa64_avx512f(auVar3);
      auVar3 = vmovdqa64_avx512f(local_2140);
      auVar4 = vmovdqa64_avx512f(local_2140);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vmovdqa64_avx512f(auVar3);
      auVar4 = vmovdqa64_avx512f(auVar4);
      auVar3 = vpaddb_avx512bw(auVar3,auVar4);
      local_2140 = vmovdqa64_avx512f(auVar3);
    }
  }
  for (local_19a8 = local_19a8 << 5; local_19a8 < in_ESI; local_19a8 = local_19a8 + 1) {
    for (local_2148 = 0; local_2148 < 0x10; local_2148 = local_2148 + 1) {
      *(int *)(in_RDX + (long)local_2148 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_19a8 * 2) & 1 << ((byte)local_2148 & 0x1f)) >>
           ((byte)local_2148 & 0x1f)) + *(int *)(in_RDX + (long)local_2148 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_blend_popcnt_unroll8(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    size_t i = 0;
    for (/**/; i + 8 <= n_cycles; i += 8) {
#define L(p) __m512i v##p = _mm512_loadu_si512(data_vectors+i+p);
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 

#define U0(p,k) __m512i input##p = _mm512_ternarylogic_epi32(v##p, _mm512_set1_epi16(0x00FF), _mm512_slli_epi16(v##k, 8), AND_OR);
#define U1(p,k) __m512i input##k = _mm512_ternarylogic_epi32(v##p, _mm512_set1_epi16((int16_t)0xFF00), _mm512_srli_epi16(v##k, 8), AND_OR);
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U( 2, 3) U( 4, 5) U( 6, 7)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3) A(4,5) A(6, 7)

#define P0(p) input##p = _mm512_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3) P(4,5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}